

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem.c
# Opt level: O2

int nn_sem_wait(nn_sem *self)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint *puVar4;
  
  iVar1 = sem_wait((sem_t *)self);
  if (iVar1 < 0) {
    puVar4 = (uint *)__errno_location();
    if (*puVar4 != 4) goto LAB_0011853f;
    iVar2 = -4;
  }
  else {
    iVar2 = 0;
    if (iVar1 != 0) {
      puVar4 = (uint *)__errno_location();
LAB_0011853f:
      __stream = _stderr;
      pcVar3 = nn_err_strerror(*puVar4);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/sem.c"
              ,0xa2);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return iVar2;
}

Assistant:

int nn_sem_wait (struct nn_sem *self)
{
    int rc;

    rc = sem_wait (&self->sem);
    if (nn_slow (rc < 0 && errno == EINTR))
        return -EINTR;
    errno_assert (rc == 0);
    return 0;
}